

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O1

void test_dt_float(void)

{
  char cVar1;
  XSValue_Data expValue;
  XSValue_Data expValue_00;
  XSValue_Data expValue_01;
  XSValue_Data expValue_02;
  XSValue_Data expValue_03;
  XSValue_Data expValue_04;
  XSValue_Data expValue_05;
  XSValue_Data expValue_06;
  XSValue_Data expValue_07;
  ulong uVar2;
  char cVar3;
  bool bVar4;
  XSValue_Data *pXVar5;
  XSValue *pXVar6;
  wchar16 *pwVar7;
  char *pcVar8;
  long lVar9;
  int iVar10;
  void *pvVar11;
  char *pcVar12;
  Status myStatus;
  Status myStatus_22;
  char lex_v_ran_iv_4_canrep [2];
  char lex_v_ran_iv_3_canrep [2];
  char lex_iv_2 [8];
  char lex_v_ran_iv_1_canrep [4];
  char lex_iv_1 [9];
  char lex_v_ran_iv_2_canrep [5];
  char data_canrep_4 [6];
  char data_canrep_5 [9];
  char data_canrep_2 [9];
  char data_canrep_3 [10];
  char data_canrep_1 [10];
  char lex_v_ran_iv_4 [17];
  char lex_v_ran_iv_3 [17];
  char lex_v_ran_iv_2 [17];
  char lex_v_ran_iv_1 [17];
  char data_rawstr_2 [8];
  char data_rawstr_5 [11];
  char data_rawstr_4 [11];
  char data_rawstr_3 [14];
  char lex_v_ran_v_4 [17];
  char lex_v_ran_v_3 [17];
  char lex_v_ran_v_2 [17];
  char lex_v_ran_v_1 [17];
  char lex_v_ran_v_0 [15];
  char data_rawstr_1 [16];
  StrX local_470;
  char *local_460;
  ulong local_458;
  Status local_450;
  char local_44c [2];
  undefined2 local_44a;
  char local_448 [12];
  char local_43c [4];
  undefined8 local_438;
  undefined1 local_430;
  char local_428 [8];
  char local_420 [8];
  char local_418 [16];
  char local_408 [16];
  char local_3f8 [16];
  char local_3e8 [16];
  char local_3d8 [32];
  char local_3b8 [32];
  char local_398 [32];
  char local_378 [24];
  char local_360 [8];
  undefined7 local_358;
  undefined4 uStack_351;
  char local_348 [16];
  char local_338 [16];
  char local_328 [32];
  char local_308 [32];
  char local_2e8 [32];
  char local_2c8 [32];
  char local_2a8 [16];
  char local_298 [16];
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  ulong local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined4 uStack_168;
  undefined4 uStack_164;
  undefined4 uStack_160;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 local_bc;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined4 uStack_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined8 uStack_8c;
  undefined8 local_84;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  undefined4 uStack_74;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined8 uStack_54;
  undefined8 local_4c;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 uStack_38;
  
  builtin_strncpy(local_2a8,"  1234.e+10  \n",0xf);
  builtin_strncpy(local_2c8,"+3.402823466e+38",0x11);
  builtin_strncpy(local_2e8,"-3.402823466e+38",0x11);
  builtin_strncpy(local_308,"+1.175494351e-38",0x11);
  builtin_strncpy(local_328,"-1.175494351e-38",0x11);
  builtin_strncpy(local_378,"+3.402823466e+39",0x11);
  builtin_strncpy(local_398,"-3.402823466e+39",0x11);
  builtin_strncpy(local_3b8,"+1.175494351e-46",0x11);
  builtin_strncpy(local_3d8,"-1.175494351e-46",0x11);
  builtin_strncpy(local_43c,"INF",4);
  builtin_strncpy(local_428,"-INF",5);
  local_44a = 0x30;
  local_44c[0] = '0';
  local_44c[1] = '\0';
  local_430 = 0;
  local_438 = 0x30312b652e783231;
  builtin_strncpy(local_448,"12.e+1x",8);
  builtin_strncpy(local_298,"   -123.45    \n",0x10);
  builtin_strncpy(local_3e8,"-1.2345E2",10);
  builtin_strncpy(local_360,"+123.45",8);
  builtin_strncpy(local_408,"1.2345E2",9);
  builtin_strncpy(local_338 + 8,"+0012",6);
  builtin_strncpy(local_338,"+123.45e",8);
  builtin_strncpy(local_3f8,"1.2345E14",10);
  builtin_strncpy(local_348,"+100.000e2",0xb);
  builtin_strncpy(local_420,"1.0E4",6);
  local_358 = 0x322e3030313030;
  uStack_351 = 0x326533;
  builtin_strncpy(local_418,"1.0023E4",9);
  local_460 = (char *)((ulong)local_460 & 0xffffffff00000000);
  local_470.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_2a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_470.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_2a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar3 = xercesc_4_0::XSValue::validate
                    (local_470.fUnicodeForm,dt_float,(Status *)&local_460,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_470);
  if (cVar3 == '\0') {
    StrX::StrX(&local_470,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x3ea,local_2a8,local_470.fLocalForm,1);
    StrX::~StrX(&local_470);
    errSeen = 1;
  }
  local_460 = (char *)((ulong)local_460 & 0xffffffff00000000);
  local_470.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_2c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_470.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_2c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar3 = xercesc_4_0::XSValue::validate
                    (local_470.fUnicodeForm,dt_float,(Status *)&local_460,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_470);
  if (cVar3 == '\0') {
    StrX::StrX(&local_470,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x3eb,local_2c8,local_470.fLocalForm,1);
    StrX::~StrX(&local_470);
    errSeen = 1;
  }
  local_460 = (char *)((ulong)local_460 & 0xffffffff00000000);
  local_470.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_2e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_470.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_2e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar3 = xercesc_4_0::XSValue::validate
                    (local_470.fUnicodeForm,dt_float,(Status *)&local_460,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_470);
  if (cVar3 == '\0') {
    StrX::StrX(&local_470,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x3ec,local_2e8,local_470.fLocalForm,1);
    StrX::~StrX(&local_470);
    errSeen = 1;
  }
  local_460 = (char *)((ulong)local_460 & 0xffffffff00000000);
  local_470.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_308,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_470.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_308,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar3 = xercesc_4_0::XSValue::validate
                    (local_470.fUnicodeForm,dt_float,(Status *)&local_460,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_470);
  if (cVar3 == '\0') {
    StrX::StrX(&local_470,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x3ed,local_308,local_470.fLocalForm,1);
    StrX::~StrX(&local_470);
    errSeen = 1;
  }
  local_460 = (char *)((ulong)local_460 & 0xffffffff00000000);
  local_470.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_328,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_470.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_328,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar3 = xercesc_4_0::XSValue::validate
                    (local_470.fUnicodeForm,dt_float,(Status *)&local_460,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_470);
  if (cVar3 == '\0') {
    StrX::StrX(&local_470,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x3ee,local_328,local_470.fLocalForm,1);
    StrX::~StrX(&local_470);
    errSeen = 1;
  }
  local_460 = (char *)((ulong)local_460 & 0xffffffff00000000);
  local_470.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_378,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_470.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_378,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar3 = xercesc_4_0::XSValue::validate
                    (local_470.fUnicodeForm,dt_float,(Status *)&local_460,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_470);
  if (cVar3 == '\0') {
    StrX::StrX(&local_470,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x3f1,local_378,local_470.fLocalForm,1);
    StrX::~StrX(&local_470);
    errSeen = 1;
  }
  local_460 = (char *)((ulong)local_460 & 0xffffffff00000000);
  local_470.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_398,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_470.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_398,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar3 = xercesc_4_0::XSValue::validate
                    (local_470.fUnicodeForm,dt_float,(Status *)&local_460,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_470);
  if (cVar3 == '\0') {
    StrX::StrX(&local_470,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x3f2,local_398,local_470.fLocalForm,1);
    StrX::~StrX(&local_470);
    errSeen = 1;
  }
  local_460 = (char *)((ulong)local_460 & 0xffffffff00000000);
  local_470.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_3b8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_470.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_3b8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar3 = xercesc_4_0::XSValue::validate
                    (local_470.fUnicodeForm,dt_float,(Status *)&local_460,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_470);
  if (cVar3 == '\0') {
    StrX::StrX(&local_470,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x3f3,local_3b8,local_470.fLocalForm,1);
    StrX::~StrX(&local_470);
    errSeen = 1;
  }
  local_460 = (char *)((ulong)local_460 & 0xffffffff00000000);
  local_470.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_3d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_470.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_3d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar3 = xercesc_4_0::XSValue::validate
                    (local_470.fUnicodeForm,dt_float,(Status *)&local_460,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_470);
  if (cVar3 == '\0') {
    StrX::StrX(&local_470,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x3f4,local_3d8,local_470.fLocalForm,1);
    StrX::~StrX(&local_470);
    errSeen = 1;
  }
  local_460 = (char *)((ulong)local_460 & 0xffffffff00000000);
  local_470.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         ((char *)&local_438,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_470.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ((char *)&local_438,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar3 = xercesc_4_0::XSValue::validate
                    (local_470.fUnicodeForm,dt_float,(Status *)&local_460,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_470);
  if (cVar3 == '\0') {
    if ((int)local_460 != 6) {
      StrX::StrX(&local_470,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      if (((ulong)local_460 & 0xffffffff) < 0xb) {
        pcVar12 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_460 & 0xffffffff];
      }
      else {
        pcVar12 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x3f7,&local_438,local_470.fLocalForm,"st_FOCA0002",pcVar12);
      goto LAB_0010617f;
    }
  }
  else {
    StrX::StrX(&local_470,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x3f7,&local_438,local_470.fLocalForm,0);
LAB_0010617f:
    StrX::~StrX(&local_470);
    errSeen = 1;
  }
  local_460 = (char *)((ulong)local_460 & 0xffffffff00000000);
  local_470.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_448,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_470.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_448,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar3 = xercesc_4_0::XSValue::validate
                    (local_470.fUnicodeForm,dt_float,(Status *)&local_460,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_470);
  if (cVar3 == '\0') {
    if ((int)local_460 == 6) goto LAB_00106291;
    StrX::StrX(&local_470,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
    if (((ulong)local_460 & 0xffffffff) < 0xb) {
      pcVar12 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_460 & 0xffffffff];
    }
    else {
      pcVar12 = "st_UnknownType";
    }
    printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
           ,0x3f8,local_448,local_470.fLocalForm,"st_FOCA0002",pcVar12);
  }
  else {
    StrX::StrX(&local_470,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x3f8,local_448,local_470.fLocalForm,0);
  }
  StrX::~StrX(&local_470);
  errSeen = 1;
LAB_00106291:
  iVar10 = 1;
  do {
    local_458 = CONCAT44(local_458._4_4_,iVar10);
    local_460 = (char *)((ulong)local_460 & 0xffffffff00000000);
    local_470.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_2a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_470.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_2a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar11 = (void *)0x3;
    pXVar5 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_470.fUnicodeForm,dt_float,(Status *)&local_460,ver_10,iVar10 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_470);
    if (pXVar5 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_470,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x416,local_2a8);
      StrX::~StrX(&local_470);
      errSeen = 1;
      iVar10 = (int)local_458;
    }
    else {
      uStack_140 = 0x55339215;
      uStack_128 = uStack_38;
      uStack_13c = (undefined4)local_4c;
      uStack_138 = (undefined4)((ulong)local_4c >> 0x20);
      expValue.fValue.f_datetime.f_month = uStack_13c;
      expValue.fValue.f_int = 0x55339215;
      expValue.fValue.f_datetime.f_hour = uStack_44;
      expValue.fValue.f_datetime.f_day = uStack_138;
      expValue.fValue.f_datetime.f_second = uStack_3c;
      expValue.fValue.f_datetime.f_min = uStack_40;
      expValue._0_8_ = local_148;
      expValue.fValue.f_datetime.f_milisec = (double)uStack_38;
      bVar4 = compareActualValue(dt_float,*pXVar5,expValue);
      iVar10 = (int)local_458;
      if (!bVar4) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar11);
    }
    local_460 = (char *)((ulong)local_460 & 0xffffffff00000000);
    local_470.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_2c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_470.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_2c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar11 = (void *)0x3;
    pXVar5 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_470.fUnicodeForm,dt_float,(Status *)&local_460,ver_10,iVar10 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_470);
    if (pXVar5 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_470,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x417,local_2c8);
      StrX::~StrX(&local_470);
      errSeen = 1;
      iVar10 = (int)local_458;
    }
    else {
      uStack_168 = 0x7f7fffff;
      uStack_150 = uStack_54;
      uStack_164 = (undefined4)local_68;
      uStack_160 = (undefined4)((ulong)local_68 >> 0x20);
      expValue_00.fValue.f_datetime.f_month = uStack_164;
      expValue_00.fValue.f_int = 0x7f7fffff;
      expValue_00.fValue.f_datetime.f_hour = uStack_60;
      expValue_00.fValue.f_datetime.f_day = uStack_160;
      expValue_00.fValue.f_datetime.f_second = uStack_58;
      expValue_00.fValue.f_datetime.f_min = uStack_5c;
      expValue_00._0_8_ = local_170;
      expValue_00.fValue.f_datetime.f_milisec = (double)uStack_54;
      bVar4 = compareActualValue(dt_float,*pXVar5,expValue_00);
      iVar10 = (int)local_458;
      if (!bVar4) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar11);
    }
    local_460 = (char *)((ulong)local_460 & 0xffffffff00000000);
    local_470.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_2e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_470.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_2e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar11 = (void *)0x3;
    pXVar5 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_470.fUnicodeForm,dt_float,(Status *)&local_460,ver_10,iVar10 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_470);
    if (pXVar5 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_470,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x418,local_2e8);
      StrX::~StrX(&local_470);
      errSeen = 1;
    }
    else {
      uStack_190 = 0xff7fffff;
      uStack_178 = uStack_70;
      uStack_18c = (undefined4)local_84;
      uStack_188 = (undefined4)((ulong)local_84 >> 0x20);
      expValue_01.fValue.f_datetime.f_month = uStack_18c;
      expValue_01.fValue.f_int = 0xff7fffff;
      expValue_01.fValue.f_datetime.f_hour = uStack_7c;
      expValue_01.fValue.f_datetime.f_day = uStack_188;
      expValue_01.fValue.f_datetime.f_second = uStack_74;
      expValue_01.fValue.f_datetime.f_min = uStack_78;
      expValue_01._0_8_ = local_198;
      expValue_01.fValue.f_datetime.f_milisec = (double)uStack_70;
      bVar4 = compareActualValue(dt_float,*pXVar5,expValue_01);
      if (!bVar4) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar11);
    }
    local_460 = (char *)((ulong)local_460 & 0xffffffff00000000);
    local_470.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_308,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_470.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_308,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar11 = (void *)0x3;
    pXVar5 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_470.fUnicodeForm,dt_float,(Status *)&local_460,ver_10,iVar10 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_470);
    if (pXVar5 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_470,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x419,local_308);
      StrX::~StrX(&local_470);
      errSeen = 1;
    }
    else {
      uStack_1b8 = 0x800000;
      uStack_1a0 = uStack_8c;
      uStack_1b4 = (undefined4)local_a0;
      uStack_1b0 = (undefined4)((ulong)local_a0 >> 0x20);
      expValue_02.fValue.f_datetime.f_month = uStack_1b4;
      expValue_02.fValue.f_int = 0x800000;
      expValue_02.fValue.f_datetime.f_hour = uStack_98;
      expValue_02.fValue.f_datetime.f_day = uStack_1b0;
      expValue_02.fValue.f_datetime.f_second = uStack_90;
      expValue_02.fValue.f_datetime.f_min = uStack_94;
      expValue_02._0_8_ = local_1c0;
      expValue_02.fValue.f_datetime.f_milisec = (double)uStack_8c;
      bVar4 = compareActualValue(dt_float,*pXVar5,expValue_02);
      if (!bVar4) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar11);
    }
    local_460 = (char *)((ulong)local_460 & 0xffffffff00000000);
    local_470.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_328,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_470.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_328,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar11 = (void *)0x3;
    pXVar5 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_470.fUnicodeForm,dt_float,(Status *)&local_460,ver_10,iVar10 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_470);
    if (pXVar5 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_470,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x41a,local_328);
      StrX::~StrX(&local_470);
      errSeen = 1;
    }
    else {
      uStack_1e0 = 0x80800000;
      uStack_1c8 = uStack_a8;
      uStack_1dc = (undefined4)local_bc;
      uStack_1d8 = (undefined4)((ulong)local_bc >> 0x20);
      expValue_03.fValue.f_datetime.f_month = uStack_1dc;
      expValue_03.fValue.f_float = -1.1754944e-38;
      expValue_03.fValue.f_datetime.f_hour = uStack_b4;
      expValue_03.fValue.f_datetime.f_day = uStack_1d8;
      expValue_03.fValue.f_datetime.f_second = uStack_ac;
      expValue_03.fValue.f_datetime.f_min = uStack_b0;
      expValue_03._0_8_ = local_1e8;
      expValue_03.fValue.f_datetime.f_milisec = (double)uStack_a8;
      bVar4 = compareActualValue(dt_float,*pXVar5,expValue_03);
      if (!bVar4) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar11);
    }
    local_460 = (char *)((ulong)local_460 & 0xffffffff00000000);
    local_470.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_378,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_470.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_378,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar11 = (void *)0x3;
    pXVar5 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_470.fUnicodeForm,dt_float,(Status *)&local_460,ver_10,iVar10 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_470);
    if (pXVar5 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_470,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x41d,local_378);
      StrX::~StrX(&local_470);
      errSeen = 1;
    }
    else {
      uStack_208 = 0x100000000;
      local_1f0 = local_c8;
      local_200 = local_d8;
      uStack_1f8 = uStack_d0;
      expValue_04.fValue.f_long = 0x100000000;
      expValue_04._0_8_ = local_210;
      expValue_04.fValue._8_8_ = local_d8;
      expValue_04.fValue._16_8_ = uStack_d0;
      expValue_04.fValue.f_datetime.f_milisec = (double)local_c8;
      bVar4 = compareActualValue(dt_float,*pXVar5,expValue_04);
      if (!bVar4) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar11);
    }
    local_460 = (char *)((ulong)local_460 & 0xffffffff00000000);
    local_470.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_398,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_470.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_398,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar11 = (void *)0x3;
    pXVar5 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_470.fUnicodeForm,dt_float,(Status *)&local_460,ver_10,iVar10 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_470);
    if (pXVar5 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_470,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x41e,local_398);
      StrX::~StrX(&local_470);
      errSeen = 1;
    }
    else {
      uStack_230 = 0;
      local_218 = local_e0;
      local_228 = local_f0;
      uStack_220 = uStack_e8;
      expValue_05.fValue.f_long = 0;
      expValue_05._0_8_ = local_238;
      expValue_05.fValue._8_8_ = local_f0;
      expValue_05.fValue._16_8_ = uStack_e8;
      expValue_05.fValue.f_datetime.f_milisec = (double)local_e0;
      bVar4 = compareActualValue(dt_float,*pXVar5,expValue_05);
      if (!bVar4) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar11);
    }
    local_460 = (char *)((ulong)local_460 & 0xffffffff00000000);
    local_470.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_3b8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_470.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_3b8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar11 = (void *)0x3;
    pXVar5 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_470.fUnicodeForm,dt_float,(Status *)&local_460,ver_10,iVar10 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_470);
    if (pXVar5 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_470,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x41f,local_3b8);
      StrX::~StrX(&local_470);
      errSeen = 1;
    }
    else {
      uStack_258 = 0x300000000;
      local_240 = local_f8;
      local_250 = local_108;
      uStack_248 = uStack_100;
      expValue_06.fValue.f_long = 0x300000000;
      expValue_06._0_8_ = local_260;
      expValue_06.fValue._8_8_ = local_108;
      expValue_06.fValue._16_8_ = uStack_100;
      expValue_06.fValue.f_datetime.f_milisec = (double)local_f8;
      bVar4 = compareActualValue(dt_float,*pXVar5,expValue_06);
      if (!bVar4) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar11);
    }
    local_460 = (char *)((ulong)local_460 & 0xffffffff00000000);
    local_470.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_3d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_470.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_3d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar11 = (void *)0x3;
    pXVar5 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_470.fUnicodeForm,dt_float,(Status *)&local_460,ver_10,iVar10 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_470);
    if (pXVar5 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_470,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x420,local_3d8);
      StrX::~StrX(&local_470);
      errSeen = 1;
    }
    else {
      uStack_280 = 0x300000000;
      local_268 = local_110;
      local_278 = local_120;
      uStack_270 = uStack_118;
      expValue_07.fValue.f_long = 0x300000000;
      expValue_07._0_8_ = local_288;
      expValue_07.fValue._8_8_ = local_120;
      expValue_07.fValue._16_8_ = uStack_118;
      expValue_07.fValue.f_datetime.f_milisec = (double)local_110;
      bVar4 = compareActualValue(dt_float,*pXVar5,expValue_07);
      if (!bVar4) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar11);
    }
    local_460 = (char *)((ulong)local_460 & 0xffffffff00000000);
    local_470.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_438,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_470.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_438,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_470.fUnicodeForm,dt_float,(Status *)&local_460,ver_10,iVar10 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_470);
    if (pXVar6 == (XSValue *)0x0) {
      if ((int)local_460 != 6) {
        StrX::StrX(&local_470,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
        pcVar12 = "st_UnknownType";
        if (((ulong)local_460 & 0xffffffff) < 0xb) {
          pcVar12 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_460 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x423,&local_438,local_470.fLocalForm,"st_FOCA0002",pcVar12);
        StrX::~StrX(&local_470);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_470,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      pvVar11 = (void *)0x423;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x423,&local_438);
      StrX::~StrX(&local_470);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar6);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar11);
    }
    local_460 = (char *)((ulong)local_460 & 0xffffffff00000000);
    local_470.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_448,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_470.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_448,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_470.fUnicodeForm,dt_float,(Status *)&local_460,ver_10,iVar10 == 1,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_470);
    if (pXVar6 == (XSValue *)0x0) {
      if ((int)local_460 != 6) {
        StrX::StrX(&local_470,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
        pcVar12 = "st_UnknownType";
        if (((ulong)local_460 & 0xffffffff) < 0xb) {
          pcVar12 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_460 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x424,local_448,local_470.fLocalForm,"st_FOCA0002",pcVar12);
        StrX::~StrX(&local_470);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_470,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      pvVar11 = (void *)0x424;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x424,local_448);
      StrX::~StrX(&local_470);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar6);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar11);
    }
    iVar10 = iVar10 + -1;
  } while (iVar10 == 0);
  local_458 = 0;
  do {
    iVar10 = (int)local_458;
    local_450 = st_Init;
    local_470.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_298,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_470.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_298,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_470.fUnicodeForm,dt_float,&local_450,ver_10,iVar10 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_470);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_470,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x444,local_298);
      StrX::~StrX(&local_470);
      errSeen = 1;
      iVar10 = (int)local_458;
    }
    else {
      local_460 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar12 = local_3e8;
      iVar10 = (int)local_458;
      if (local_460 != pcVar12) {
        pcVar8 = local_460;
        if (local_460 == (char *)0x0) {
LAB_00107125:
          if (*pcVar12 == '\0') goto LAB_00107175;
        }
        else {
          do {
            cVar3 = *pcVar8;
            if (cVar3 == '\0') goto LAB_00107125;
            pcVar8 = pcVar8 + 1;
            cVar1 = *pcVar12;
            pcVar12 = pcVar12 + 1;
          } while (cVar3 == cVar1);
        }
        StrX::StrX(&local_470,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x444,local_298,local_470.fLocalForm,local_460,local_3e8);
        StrX::~StrX(&local_470);
        errSeen = 1;
      }
LAB_00107175:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release(&local_460,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_450 = st_Init;
    local_470.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_360,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_470.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_360,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_470.fUnicodeForm,dt_float,&local_450,ver_10,iVar10 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_470);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_470,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x445,local_360);
      StrX::~StrX(&local_470);
      errSeen = 1;
      iVar10 = (int)local_458;
    }
    else {
      local_460 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar12 = local_408;
      iVar10 = (int)local_458;
      if (local_460 != pcVar12) {
        pcVar8 = local_460;
        if (local_460 == (char *)0x0) {
LAB_0010727b:
          if (*pcVar12 == '\0') goto LAB_001072cb;
        }
        else {
          do {
            cVar3 = *pcVar8;
            if (cVar3 == '\0') goto LAB_0010727b;
            pcVar8 = pcVar8 + 1;
            cVar1 = *pcVar12;
            pcVar12 = pcVar12 + 1;
          } while (cVar3 == cVar1);
        }
        StrX::StrX(&local_470,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x445,local_360,local_470.fLocalForm,local_460,local_408);
        StrX::~StrX(&local_470);
        errSeen = 1;
      }
LAB_001072cb:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release(&local_460,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_450 = st_Init;
    local_470.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_338,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_470.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_338,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_470.fUnicodeForm,dt_float,&local_450,ver_10,iVar10 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_470);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_470,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x446,local_338);
      StrX::~StrX(&local_470);
      errSeen = 1;
    }
    else {
      local_460 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar12 = local_3f8;
      if (local_460 != pcVar12) {
        pcVar8 = local_460;
        if (local_460 == (char *)0x0) {
LAB_001073c9:
          if (*pcVar12 == '\0') goto LAB_00107419;
        }
        else {
          do {
            cVar3 = *pcVar8;
            if (cVar3 == '\0') goto LAB_001073c9;
            pcVar8 = pcVar8 + 1;
            cVar1 = *pcVar12;
            pcVar12 = pcVar12 + 1;
          } while (cVar3 == cVar1);
        }
        StrX::StrX(&local_470,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x446,local_338,local_470.fLocalForm,local_460,local_3f8);
        StrX::~StrX(&local_470);
        errSeen = 1;
      }
LAB_00107419:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release(&local_460,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_450 = st_Init;
    local_470.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_348,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_470.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_348,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_470.fUnicodeForm,dt_float,&local_450,ver_10,iVar10 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_470);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_470,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x447,local_348);
      StrX::~StrX(&local_470);
      errSeen = 1;
    }
    else {
      local_460 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar12 = local_420;
      if (local_460 != pcVar12) {
        pcVar8 = local_460;
        if (local_460 == (char *)0x0) {
LAB_00107517:
          if (*pcVar12 == '\0') goto LAB_00107567;
        }
        else {
          do {
            cVar3 = *pcVar8;
            if (cVar3 == '\0') goto LAB_00107517;
            pcVar8 = pcVar8 + 1;
            cVar1 = *pcVar12;
            pcVar12 = pcVar12 + 1;
          } while (cVar3 == cVar1);
        }
        StrX::StrX(&local_470,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x447,local_348,local_470.fLocalForm,local_460,local_420);
        StrX::~StrX(&local_470);
        errSeen = 1;
      }
LAB_00107567:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release(&local_460,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_450 = st_Init;
    local_470.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_358,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_470.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_358,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_470.fUnicodeForm,dt_float,&local_450,ver_10,iVar10 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_470);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_470,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x448,&local_358);
      StrX::~StrX(&local_470);
      errSeen = 1;
    }
    else {
      local_460 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar12 = local_418;
      if (local_460 != pcVar12) {
        pcVar8 = local_460;
        if (local_460 == (char *)0x0) {
LAB_0010766a:
          if (*pcVar12 == '\0') goto LAB_001076ba;
        }
        else {
          do {
            cVar3 = *pcVar8;
            if (cVar3 == '\0') goto LAB_0010766a;
            pcVar8 = pcVar8 + 1;
            cVar1 = *pcVar12;
            pcVar12 = pcVar12 + 1;
          } while (cVar3 == cVar1);
        }
        StrX::StrX(&local_470,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x448,&local_358,local_470.fLocalForm,local_460,local_418);
        StrX::~StrX(&local_470);
        errSeen = 1;
      }
LAB_001076ba:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release(&local_460,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    bVar4 = (int)local_458 == 0;
    local_460 = (char *)((ulong)local_460 & 0xffffffff00000000);
    local_470.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_438,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_470.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_438,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_470.fUnicodeForm,dt_float,(Status *)&local_460,ver_10,bVar4,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_470);
    uVar2 = local_458;
    if (lVar9 == 0) {
      if ((int)local_460 != 6) {
        StrX::StrX(&local_470,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
        pcVar12 = "st_UnknownType";
        if (((ulong)local_460 & 0xffffffff) < 0xb) {
          pcVar12 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_460 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,1099,&local_438,local_470.fLocalForm,"st_FOCA0002",pcVar12);
        StrX::~StrX(&local_470);
        goto LAB_001077e8;
      }
    }
    else {
      StrX::StrX(&local_470,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,1099,&local_438);
      StrX::~StrX(&local_470);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar9);
LAB_001077e8:
      errSeen = 1;
    }
    local_460 = (char *)((ulong)local_460 & 0xffffffff00000000);
    local_470.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_448,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_470.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_448,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_470.fUnicodeForm,dt_float,(Status *)&local_460,ver_10,(int)uVar2 == 0,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_470);
    uVar2 = local_458;
    if (lVar9 == 0) {
      if ((int)local_460 != 6) {
        StrX::StrX(&local_470,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
        pcVar12 = "st_UnknownType";
        if (((ulong)local_460 & 0xffffffff) < 0xb) {
          pcVar12 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_460 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x44c,local_448,local_470.fLocalForm,"st_FOCA0002",pcVar12);
        StrX::~StrX(&local_470);
        goto LAB_001078fe;
      }
    }
    else {
      StrX::StrX(&local_470,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x44c,local_448);
      StrX::~StrX(&local_470);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar9);
LAB_001078fe:
      errSeen = 1;
    }
    local_450 = st_Init;
    local_470.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_378,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_470.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_378,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_470.fUnicodeForm,dt_float,&local_450,ver_10,(int)uVar2 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_470);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_470,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x44f,local_378);
      StrX::~StrX(&local_470);
      errSeen = 1;
      iVar10 = (int)local_458;
    }
    else {
      local_460 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar12 = local_43c;
      iVar10 = (int)local_458;
      if (local_460 != pcVar12) {
        pcVar8 = local_460;
        if (local_460 == (char *)0x0) {
LAB_001079ef:
          if (*pcVar12 == '\0') goto LAB_00107a3f;
        }
        else {
          do {
            cVar3 = *pcVar8;
            if (cVar3 == '\0') goto LAB_001079ef;
            pcVar8 = pcVar8 + 1;
            cVar1 = *pcVar12;
            pcVar12 = pcVar12 + 1;
          } while (cVar3 == cVar1);
        }
        StrX::StrX(&local_470,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x44f,local_378,local_470.fLocalForm,local_460,local_43c);
        StrX::~StrX(&local_470);
        errSeen = 1;
      }
LAB_00107a3f:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release(&local_460,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_450 = st_Init;
    local_470.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_398,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_470.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_398,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_470.fUnicodeForm,dt_float,&local_450,ver_10,iVar10 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_470);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_470,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x450,local_398);
      StrX::~StrX(&local_470);
      errSeen = 1;
      iVar10 = (int)local_458;
    }
    else {
      local_460 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar12 = local_428;
      iVar10 = (int)local_458;
      if (local_460 != pcVar12) {
        pcVar8 = local_460;
        if (local_460 == (char *)0x0) {
LAB_00107b42:
          if (*pcVar12 == '\0') goto LAB_00107b92;
        }
        else {
          do {
            cVar3 = *pcVar8;
            if (cVar3 == '\0') goto LAB_00107b42;
            pcVar8 = pcVar8 + 1;
            cVar1 = *pcVar12;
            pcVar12 = pcVar12 + 1;
          } while (cVar3 == cVar1);
        }
        StrX::StrX(&local_470,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x450,local_398,local_470.fLocalForm,local_460,local_428);
        StrX::~StrX(&local_470);
        errSeen = 1;
      }
LAB_00107b92:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release(&local_460,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_450 = st_Init;
    local_470.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_3b8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_470.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_3b8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_470.fUnicodeForm,dt_float,&local_450,ver_10,iVar10 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_470);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_470,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x451,local_3b8);
      StrX::~StrX(&local_470);
      errSeen = 1;
      iVar10 = (int)local_458;
    }
    else {
      local_460 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar12 = (char *)&local_44a;
      iVar10 = (int)local_458;
      if (local_460 != pcVar12) {
        pcVar8 = local_460;
        if (local_460 == (char *)0x0) {
LAB_00107c92:
          if (*pcVar12 == '\0') goto LAB_00107cdf;
        }
        else {
          do {
            cVar3 = *pcVar8;
            if (cVar3 == '\0') goto LAB_00107c92;
            pcVar8 = pcVar8 + 1;
            cVar1 = *pcVar12;
            pcVar12 = pcVar12 + 1;
          } while (cVar3 == cVar1);
        }
        StrX::StrX(&local_470,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x451,local_3b8,local_470.fLocalForm,local_460,&local_44a);
        StrX::~StrX(&local_470);
        errSeen = 1;
      }
LAB_00107cdf:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release(&local_460,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_450 = st_Init;
    local_470.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_3d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_470.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_3d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_470.fUnicodeForm,dt_float,&local_450,ver_10,iVar10 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_470);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_470,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x452,local_3d8);
      StrX::~StrX(&local_470);
      errSeen = 1;
      iVar10 = (int)local_458;
    }
    else {
      local_460 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar12 = local_44c;
      iVar10 = (int)local_458;
      if (local_460 != pcVar12) {
        pcVar8 = local_460;
        if (local_460 == (char *)0x0) {
LAB_00107de2:
          if (*pcVar12 == '\0') goto LAB_00107e2f;
        }
        else {
          do {
            cVar3 = *pcVar8;
            if (cVar3 == '\0') goto LAB_00107de2;
            pcVar8 = pcVar8 + 1;
            cVar1 = *pcVar12;
            pcVar12 = pcVar12 + 1;
          } while (cVar3 == cVar1);
        }
        StrX::StrX(&local_470,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x452,local_3d8,local_470.fLocalForm,local_460,local_44c);
        StrX::~StrX(&local_470);
        errSeen = 1;
      }
LAB_00107e2f:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release(&local_460,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_458 = (ulong)(iVar10 + 1);
    if (iVar10 != 0) {
      return;
    }
  } while( true );
}

Assistant:

void test_dt_float()
{

    const XSValue::DataType dt = XSValue::dt_float;
    bool  toValidate = true;

    const char lex_v_ran_v_0[]="  1234.e+10  \n";
    const char lex_v_ran_v_1[]="+3.402823466e+38";
    const char lex_v_ran_v_2[]="-3.402823466e+38";
    const char lex_v_ran_v_3[]="+1.175494351e-38";
    const char lex_v_ran_v_4[]="-1.175494351e-38";

    XSValue::XSValue_Data act_v_ran_v_0; act_v_ran_v_0.fValue.f_float = (float)1234.e+10;
    XSValue::XSValue_Data act_v_ran_v_1; act_v_ran_v_1.fValue.f_float = (float)+3.402823466e+38;
    XSValue::XSValue_Data act_v_ran_v_2; act_v_ran_v_2.fValue.f_float = (float)-3.402823466e+38;
    XSValue::XSValue_Data act_v_ran_v_3; act_v_ran_v_3.fValue.f_float = (float)+1.175494351e-38;
    XSValue::XSValue_Data act_v_ran_v_4; act_v_ran_v_4.fValue.f_float = (float)-1.175494351e-38;

    const char lex_v_ran_iv_1[]="+3.402823466e+39";
    const char lex_v_ran_iv_2[]="-3.402823466e+39";
    const char lex_v_ran_iv_3[]="+1.175494351e-46";
    const char lex_v_ran_iv_4[]="-1.175494351e-46";

    XSValue::XSValue_Data lex_iv_ran_v_1; lex_iv_ran_v_1.fValue.f_float = (float)0.0;
    lex_iv_ran_v_1.fValue.f_floatType.f_floatEnum = XSValue::DoubleFloatType_PosINF;
    XSValue::XSValue_Data lex_iv_ran_v_2; lex_iv_ran_v_2.fValue.f_float = (float)0.0;
    lex_iv_ran_v_2.fValue.f_floatType.f_floatEnum = XSValue::DoubleFloatType_NegINF;
    XSValue::XSValue_Data lex_iv_ran_v_3; lex_iv_ran_v_3.fValue.f_float = (float)0.0;
    lex_iv_ran_v_3.fValue.f_floatType.f_floatEnum = XSValue::DoubleFloatType_Zero;
    XSValue::XSValue_Data lex_iv_ran_v_4; lex_iv_ran_v_4.fValue.f_float = (float)0.0;
    lex_iv_ran_v_4.fValue.f_floatType.f_floatEnum = XSValue::DoubleFloatType_Zero;

    const char lex_v_ran_iv_1_canrep[]="INF";  // " 3.402823466E39"
    const char lex_v_ran_iv_2_canrep[]="-INF"; // "-3.402823466E39";
    const char lex_v_ran_iv_3_canrep[]="0";    // " 1.175494351E-46";
    const char lex_v_ran_iv_4_canrep[]="0";    // "-1.175494351E-46";

    const char lex_iv_1[]="12x.e+10";
    const char lex_iv_2[]="12.e+1x";

/***
 * 3.2.4.2 Canonical representation
 *
 * The canonical representation for float is defined by prohibiting certain options from the Lexical
 * representation (3.2.4.1).
 * Specifically,
 * 1. the exponent must be indicated by "E".
 * 2. Leading zeroes and the preceding optional "+" sign are prohibited in the exponent.
 * 3. For the mantissa, the preceding optional "+" sign is prohibited and the decimal point is required.
 *    Leading and trailing zeroes are prohibited subject to the following:
 *    number representations must be normalized such that there is a single digit to the left of the decimal point
 *    and at least a single digit to the right of the decimal point.
 *
 ***/

    const char data_rawstr_1[]="   -123.45    \n";
    const char data_canrep_1[]="-1.2345E2";
    const char data_rawstr_2[]="+123.45";
    const char data_canrep_2[]="1.2345E2";
    const char data_rawstr_3[]="+123.45e+0012";
    const char data_canrep_3[]="1.2345E14";
    const char data_rawstr_4[]="+100.000e2";
    const char data_canrep_4[]="1.0E4";
    const char data_rawstr_5[]="00100.23e2";
    const char data_canrep_5[]="1.0023E4";

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *    lexical valid
     *            range  valid                           true              n/a
     *            range  invalid                         false           st_FOCA0002
     *    lexical invalid                                false           st_FOCA0002
     *
     ***/

    // lexical valid, range valid
    VALIDATE_TEST(lex_v_ran_v_0 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_1 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_2 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_3 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_4 , dt, EXP_RET_VALID_TRUE, DONT_CARE);

    // lexical valid, range invalid
    VALIDATE_TEST(lex_v_ran_iv_1 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_iv_2 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_iv_3 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_iv_4 , dt, EXP_RET_VALID_TRUE, DONT_CARE);

    // lexical invalid
    VALIDATE_TEST(lex_iv_1         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_iv_2         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        // lexical valid, range valid
        ACTVALUE_TEST(lex_v_ran_v_0,  dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, act_v_ran_v_0);
        ACTVALUE_TEST(lex_v_ran_v_1,  dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, act_v_ran_v_1);
        ACTVALUE_TEST(lex_v_ran_v_2,  dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, act_v_ran_v_2);
        ACTVALUE_TEST(lex_v_ran_v_3,  dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, act_v_ran_v_3);
        ACTVALUE_TEST(lex_v_ran_v_4,  dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, act_v_ran_v_4);

        // lexical valid, range invalid
        ACTVALUE_TEST(lex_v_ran_iv_1, dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, lex_iv_ran_v_1);
        ACTVALUE_TEST(lex_v_ran_iv_2, dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, lex_iv_ran_v_2);
        ACTVALUE_TEST(lex_v_ran_iv_3, dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, lex_iv_ran_v_3);
        ACTVALUE_TEST(lex_v_ran_iv_4, dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, lex_iv_ran_v_4);

        // lexical invalid
        ACTVALUE_TEST(lex_iv_1      , dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
        ACTVALUE_TEST(lex_iv_2      , dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);

    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XMLCh          n/a
     *          range  invalid                              0            st_FOCA0002
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XMLCh          n/a
     *          range  invalid                            XMLCh          n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j) ? true : false;

        // lexical valid, range valid
        CANREP_TEST(data_rawstr_1,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_1,    DONT_CARE);
        CANREP_TEST(data_rawstr_2,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_2,    DONT_CARE);
        CANREP_TEST(data_rawstr_3,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_3,    DONT_CARE);
        CANREP_TEST(data_rawstr_4,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_4,    DONT_CARE);
        CANREP_TEST(data_rawstr_5,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_5,    DONT_CARE);

        // lexical invalid
        CANREP_TEST(lex_iv_1,         dt, toValidate, EXP_RET_CANREP_FALSE, null_string,      XSValue::st_FOCA0002);
        CANREP_TEST(lex_iv_2,         dt, toValidate, EXP_RET_CANREP_FALSE, null_string,      XSValue::st_FOCA0002);

        // lexical valid, range invalid (however XML4C ignores that)
        CANREP_TEST(lex_v_ran_iv_1,    dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_1_canrep,    DONT_CARE);
        CANREP_TEST(lex_v_ran_iv_2,    dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_2_canrep,    DONT_CARE);
        CANREP_TEST(lex_v_ran_iv_3,    dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_3_canrep,    DONT_CARE);
        CANREP_TEST(lex_v_ran_iv_4,    dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_4_canrep,    DONT_CARE);
    }
}